

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O1

EncodeResult *
ZXing::Aztec::Encoder::Encode
          (EncodeResult *__return_storage_ptr__,string *data,int minECCPercent,
          int userSpecifiedLayers)

{
  pointer puVar1;
  pointer piVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  invalid_argument *piVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int i;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vector<int,_std::allocator<int>_> alignmentMap;
  BitArray stuffedBits;
  BitArray messageBits;
  BitArray bits;
  bool local_14c;
  string local_148;
  ulong local_128;
  allocator_type local_119;
  vector<int,_std::allocator<int>_> local_118;
  int local_100;
  uint local_fc;
  undefined1 local_f8 [16];
  pointer local_e8;
  long local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong local_b0;
  int local_a8;
  int local_a4;
  BitMatrix *local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  BitArray local_70;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  value_type_conflict3 local_34;
  
  HighLevelEncoder::Encode(&local_70,data);
  iVar10 = minECCPercent *
           ((int)local_70._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (int)local_70._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start);
  iVar18 = iVar10 >> 0x1f;
  iVar10 = iVar10 / 100 + iVar18;
  local_e0 = CONCAT44(local_e0._4_4_,(iVar10 - iVar18) + 0xb);
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (pointer)0x0;
  if (userSpecifiedLayers == 0) {
    iVar18 = ((int)local_70._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (int)local_70._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) + (iVar10 - iVar18) + 0xb;
    iVar10 = 0;
    local_128 = CONCAT44(local_128._4_4_,iVar18);
    uVar23 = 0;
    do {
      uVar13 = uVar23 + 1;
      uVar24 = uVar23;
      if (uVar23 < 4) {
        uVar24 = uVar13;
      }
      local_14c = uVar23 < 4;
      iVar21 = uVar24 * 0x10 + 0x70;
      if (local_14c) {
        iVar21 = uVar24 * 0x10 + 0x58;
      }
      iVar21 = iVar21 * uVar24;
      if (iVar18 <= iVar21) {
        iVar18 = *(int *)(WORD_SIZE + (ulong)uVar24 * 4);
        if (iVar10 != iVar18) {
          StuffBits(&local_70,iVar18,(BitArray *)local_f8);
          iVar10 = iVar18;
        }
        if ((3 < uVar23) ||
           (bVar27 = false, (int)(local_f8._8_4_ - local_f8._0_4_) <= iVar10 * 0x40)) {
          bVar27 = (local_f8._8_4_ - local_f8._0_4_) + (int)local_e0 <= iVar21 - iVar21 % iVar10;
        }
        if (bVar27) goto LAB_0014a293;
        iVar18 = (int)local_128;
      }
      uVar23 = uVar13;
      if (uVar13 == 0x21) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Data too large for an Aztec code");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    } while( true );
  }
  uVar25 = (ulong)(uint)-userSpecifiedLayers;
  if (0 < userSpecifiedLayers) {
    uVar25 = (ulong)(uint)userSpecifiedLayers;
  }
  uVar24 = (uint)uVar25;
  uVar23 = 0x20;
  if (userSpecifiedLayers < 0) {
    uVar23 = 4;
  }
  if (uVar23 < uVar24) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_148,userSpecifiedLayers);
    std::operator+(&local_d8,"Illegal value for layers: ",&local_148);
    std::invalid_argument::invalid_argument(piVar8,(string *)&local_d8);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar21 = uVar24 * 0x10 + 0x58;
  if (-1 < userSpecifiedLayers) {
    iVar21 = uVar24 * 0x10 + 0x70;
  }
  iVar10 = *(int *)(WORD_SIZE + uVar25 * 4);
  StuffBits(&local_70,iVar10,(BitArray *)local_f8);
  iVar21 = iVar21 * uVar24;
  if (iVar21 - iVar21 % iVar10 < (int)local_e0 + (local_f8._8_4_ - local_f8._0_4_)) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Data to large for user specified layer");
  }
  else {
    local_14c = SUB41((uint)userSpecifiedLayers >> 0x1f,0);
    if ((-1 < userSpecifiedLayers) || ((int)(local_f8._8_4_ - local_f8._0_4_) <= iVar10 * 0x40)) {
LAB_0014a293:
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      GenerateCheckWords((BitArray *)local_f8,iVar21,iVar10,(BitArray *)&local_d8);
      local_128 = (long)(int)(local_f8._8_4_ - local_f8._0_4_) / (long)iVar10 & 0xffffffff;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
      if (local_14c == false) {
        uVar23 = 4;
        do {
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = (uVar24 - 1 >> (uVar23 & 0x1f) & 1) != 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                     (uchar *)&local_118);
          bVar27 = uVar23 != 0;
          uVar23 = uVar23 - 1;
        } while (bVar27);
        iVar10 = (int)local_128;
        uVar23 = 10;
        do {
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = (iVar10 - 1U >> (uVar23 & 0x1f) & 1) != 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                     (uchar *)&local_118);
          bVar27 = uVar23 != 0;
          uVar23 = uVar23 - 1;
        } while (bVar27);
        iVar10 = 0xe;
        GenerateCheckWords((BitArray *)&local_148,0x28,4,(BitArray *)&local_148);
      }
      else {
        uVar23 = 1;
        do {
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = (uVar24 - 1 >> (uVar23 & 0x1f) & 1) != 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                     (uchar *)&local_118);
          bVar27 = uVar23 != 0;
          uVar23 = uVar23 - 1;
        } while (bVar27);
        iVar10 = (int)local_128;
        uVar23 = 5;
        do {
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = (iVar10 - 1U >> (uVar23 & 0x1f) & 1) != 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                     (uchar *)&local_118);
          bVar27 = uVar23 != 0;
          uVar23 = uVar23 - 1;
        } while (bVar27);
        iVar10 = 0xb;
        GenerateCheckWords((BitArray *)&local_148,0x1c,4,(BitArray *)&local_148);
      }
      uVar23 = iVar10 + uVar24 * 4;
      local_34 = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_118,(long)(int)uVar23,&local_34,&local_119);
      auVar6 = _DAT_001941f0;
      auVar5 = _DAT_001941e0;
      auVar4 = _DAT_001941d0;
      if (local_14c == false) {
        uVar13 = (int)uVar23 / 2;
        iVar18 = (int)((ulong)((long)(int)(uVar13 - 1) * -0x77777777) >> 0x20) + uVar13 + -1;
        iVar18 = (iVar18 >> 3) - (iVar18 >> 0x1f);
        local_fc = uVar23 + iVar18 * 2 + 1;
        if (1 < (int)uVar23) {
          iVar21 = (int)(((uVar23 + iVar18 * 2) - ((int)local_fc >> 0x1f)) + 1) >> 1;
          lVar22 = (ulong)uVar13 * 4 +
                   CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
          iVar18 = iVar21 + 1;
          lVar7 = -4;
          uVar25 = 0;
          do {
            iVar21 = iVar21 + -1;
            iVar17 = (int)((uVar25 & 0xffffffff) / 0xf);
            *(int *)(lVar22 + lVar7) = iVar21 - iVar17;
            *(int *)(lVar22 + uVar25 * 4) = (int)uVar25 + iVar18 + iVar17;
            uVar25 = uVar25 + 1;
            lVar7 = lVar7 + -4;
          } while (uVar13 != uVar25);
        }
      }
      else {
        piVar2 = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,
                                   local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_1_);
        local_fc = uVar23;
        if (piVar2 != local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          uVar25 = (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + (-4 - (long)piVar2);
          auVar30._8_4_ = (int)uVar25;
          auVar30._0_8_ = uVar25;
          auVar30._12_4_ = (int)(uVar25 >> 0x20);
          auVar28._0_8_ = uVar25 >> 2;
          auVar28._8_8_ = auVar30._8_8_ >> 2;
          uVar9 = 0;
          auVar28 = auVar28 ^ _DAT_001941f0;
          do {
            iVar21 = (int)uVar9;
            auVar29._8_4_ = iVar21;
            auVar29._0_8_ = uVar9;
            auVar29._12_4_ = (int)(uVar9 >> 0x20);
            auVar30 = (auVar29 | auVar5) ^ auVar6;
            iVar18 = auVar28._4_4_;
            if ((bool)(~(auVar30._4_4_ == iVar18 && auVar28._0_4_ < auVar30._0_4_ ||
                        iVar18 < auVar30._4_4_) & 1)) {
              piVar2[uVar9] = iVar21;
            }
            if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
                auVar30._12_4_ <= auVar28._12_4_) {
              piVar2[uVar9 + 1] = iVar21 + 1;
            }
            auVar30 = (auVar29 | auVar4) ^ auVar6;
            iVar17 = auVar30._4_4_;
            if (iVar17 <= iVar18 && (iVar17 != iVar18 || auVar30._0_4_ <= auVar28._0_4_)) {
              piVar2[uVar9 + 2] = iVar21 + 2;
              piVar2[uVar9 + 3] = iVar21 + 3;
            }
            uVar9 = uVar9 + 4;
          } while (((uVar25 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
        }
      }
      __return_storage_ptr__->compact = local_14c;
      __return_storage_ptr__->size = local_fc;
      __return_storage_ptr__->layers = uVar24;
      __return_storage_ptr__->codeWords = (int)local_128;
      local_a0 = &__return_storage_ptr__->matrix;
      local_98 = (ulong)uVar23;
      BitMatrix::BitMatrix(local_a0,local_fc,local_fc);
      uVar23 = local_fc;
      local_48 = (long)(int)uVar24;
      local_58 = 1;
      if (1 < (int)uVar24) {
        local_58 = (ulong)uVar24;
      }
      local_50 = (ulong)(local_14c ^ 1) * 3 + 9;
      local_100 = uVar24 * 4 + iVar10 + -1;
      iVar10 = (int)local_50;
      local_80 = (ulong)(uint)(iVar10 * 2) + local_48 * 8;
      local_88 = local_48 * 0x10 + (ulong)(local_14c ^ 1) * 0xc + 0x24;
      local_90 = (ulong)(uint)(iVar10 * 6) + local_48 * 0x18;
      local_b0 = 0;
      lVar22 = 0;
      uVar25 = 0;
      iVar10 = uVar24 * 0x20 + iVar10 * 8;
      do {
        local_a8 = iVar10;
        local_78 = uVar25;
        lVar7 = (local_48 - local_78) * 4;
        local_128 = lVar7 + local_50;
        if (local_128 != 0 && SCARRY8(lVar7,local_50) == (long)local_128 < 0) {
          local_e0 = (long)local_100;
          lVar12 = (long)(int)local_b0;
          lVar7 = local_80 + lVar12;
          lVar14 = local_88 + lVar12;
          lVar19 = local_90 + lVar12;
          local_a4 = ~((int)local_78 * 2) + (int)local_98;
          local_40 = (long)(~((int)local_78 * 2) + (int)local_98);
          lVar16 = 0;
          do {
            lVar26 = 0;
            lVar20 = local_e0;
            do {
              if (local_d8._M_string_length - (long)local_d8._M_dataplus._M_p <=
                  (ulong)(lVar12 + lVar26)) {
LAB_0014aef4:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              if (local_d8._M_dataplus._M_p[lVar26 + lVar12] != '\0') {
                uVar25 = (long)(__return_storage_ptr__->matrix)._width *
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        lVar16 * 4 + local_78 * 8) +
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        lVar22 + lVar26 * 4);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25) goto LAB_0014aef4;
                puVar1[uVar25] = 0xff;
              }
              if (local_d8._M_string_length - (long)local_d8._M_dataplus._M_p <=
                  (ulong)(lVar26 + lVar7)) goto LAB_0014aef4;
              if (local_d8._M_dataplus._M_p[lVar26 + lVar7] != '\0') {
                uVar25 = (long)(__return_storage_ptr__->matrix)._width *
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       (long)(int)lVar20 * 4) +
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        lVar16 * 4 + local_78 * 8);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25) goto LAB_0014aef4;
                puVar1[uVar25] = 0xff;
              }
              if (local_d8._M_string_length - (long)local_d8._M_dataplus._M_p <=
                  (ulong)(lVar14 + lVar26)) goto LAB_0014aef4;
              if (local_d8._M_dataplus._M_p[lVar26 + lVar14] != '\0') {
                uVar25 = (long)(__return_storage_ptr__->matrix)._width *
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       (local_40 - lVar16) * 4) +
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       lVar20 * 4);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25) goto LAB_0014aef4;
                puVar1[uVar25] = 0xff;
              }
              if (local_d8._M_string_length - (long)local_d8._M_dataplus._M_p <=
                  (ulong)(lVar19 + lVar26)) goto LAB_0014aef4;
              if (local_d8._M_dataplus._M_p[lVar26 + lVar19] != '\0') {
                uVar25 = (long)(__return_storage_ptr__->matrix)._width *
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        lVar22 + lVar26 * 4) +
                         (long)*(int *)(CONCAT71(local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_118.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       (long)(local_a4 - (int)lVar16) * 4);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25) goto LAB_0014aef4;
                puVar1[uVar25] = 0xff;
              }
              lVar26 = lVar26 + 1;
              lVar20 = lVar20 + -1;
            } while (lVar26 == 1);
            lVar16 = lVar16 + 1;
            lVar12 = lVar12 + 2;
            lVar7 = lVar7 + 2;
            lVar14 = lVar14 + 2;
            lVar19 = lVar19 + 2;
          } while (lVar16 < (long)local_128);
        }
        local_100 = local_100 + -2;
        lVar22 = lVar22 + 8;
        local_b0 = (ulong)(uint)((int)local_b0 + local_a8);
        local_80 = local_80 + -8;
        local_88 = local_88 + -0x10;
        local_90 = local_90 + -0x18;
        uVar25 = local_78 + 1;
        iVar10 = local_a8 + -0x20;
      } while (local_78 + 1 != local_58);
      uVar24 = (int)local_fc / 2;
      if (local_14c == false) {
        uVar25 = 0x27;
        uVar9 = 0;
        do {
          uVar11 = uVar9;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar9)
          goto LAB_0014af18;
          iVar10 = (int)uVar9;
          iVar18 = (int)((uVar9 & 0xffffffff) / 5) + (uVar24 - 5);
          if (local_148._M_dataplus._M_p[uVar9] != '\0') {
            uVar11 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (uVar24 - 7) + iVar18 +
                                 iVar10);
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar11 = uVar9 + 10;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar9 + 10)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar9 + 10] != '\0') {
            uVar11 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (iVar10 + iVar18) +
                                 uVar24 + 7);
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar11 = uVar25 - 10;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar25 - 10)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar25 - 10] != '\0') {
            uVar11 = (ulong)(int)(iVar18 + iVar10 +
                                 (__return_storage_ptr__->matrix)._width * (uVar24 + 7));
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar11 = uVar25;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar25)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar25] != '\0') {
            uVar11 = (ulong)(int)((iVar10 + iVar18) * (__return_storage_ptr__->matrix)._width +
                                 (uVar24 - 7));
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar9 = uVar9 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar9 != 10);
      }
      else {
        lVar22 = (long)(int)uVar24 + -3;
        uVar25 = 0x1b;
        uVar9 = 0;
        do {
          uVar11 = uVar9;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar9) {
LAB_0014af18:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar11);
          }
          if (local_148._M_dataplus._M_p[uVar9] != '\0') {
            lVar7 = (long)(int)((__return_storage_ptr__->matrix)._width * (uVar24 - 5));
            uVar11 = lVar22 + uVar9 + lVar7;
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar9 + lVar22 + lVar7] = 0xff;
          }
          uVar11 = uVar9 + 7;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar9 + 7)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar9 + 7] != '\0') {
            uVar11 = (ulong)(int)(((int)lVar22 + (int)uVar9) *
                                  (__return_storage_ptr__->matrix)._width + uVar24 + 5);
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar11 = uVar25 - 7;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar25 - 7)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar25 - 7] != '\0') {
            lVar7 = (long)(int)((__return_storage_ptr__->matrix)._width * (uVar24 + 5));
            uVar11 = lVar22 + uVar9 + lVar7;
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar9 + lVar22 + lVar7] = 0xff;
          }
          uVar11 = uVar25;
          if (local_148._M_string_length - (long)local_148._M_dataplus._M_p <= uVar25)
          goto LAB_0014af18;
          if (local_148._M_dataplus._M_p[uVar25] != '\0') {
            uVar11 = (ulong)(int)(((int)lVar22 + (int)uVar9) *
                                  (__return_storage_ptr__->matrix)._width + (uVar24 - 5));
            puVar1 = (__return_storage_ptr__->matrix)._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar11)
            goto LAB_0014af18;
            puVar1[uVar11] = 0xff;
          }
          uVar9 = uVar9 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar9 != 7);
      }
      if (local_14c == false) {
        DrawBullsEye(local_a0,uVar24,7);
        if (3 < (int)local_98) {
          iVar10 = 0;
          iVar18 = 0;
          uVar13 = uVar24;
          uVar15 = uVar24;
          do {
            if ((int)(uVar24 & 1) < (int)uVar23) {
              uVar25 = (ulong)(uVar24 & 1);
              do {
                uVar9 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (int)uVar25 +
                                    (uVar24 - iVar10));
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar9
                   ) {
LAB_0014af02:
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                }
                puVar1[uVar9] = 0xff;
                uVar9 = (ulong)(int)((__return_storage_ptr__->matrix)._width * (int)uVar25 +
                                    iVar10 + uVar24);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar9
                   ) goto LAB_0014af02;
                puVar1[uVar9] = 0xff;
                lVar22 = (long)(int)((__return_storage_ptr__->matrix)._width * uVar15);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25 + lVar22) goto LAB_0014af02;
                puVar1[uVar25 + lVar22] = 0xff;
                lVar22 = (long)(int)((__return_storage_ptr__->matrix)._width * uVar13);
                puVar1 = (__return_storage_ptr__->matrix)._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(__return_storage_ptr__->matrix)._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                    uVar25 + lVar22) goto LAB_0014af02;
                puVar1[uVar25 + lVar22] = 0xff;
                uVar25 = uVar25 + 2;
                uVar23 = local_fc;
              } while ((int)uVar25 < (int)local_fc);
            }
            iVar18 = iVar18 + 0xf;
            iVar10 = iVar10 + 0x10;
            uVar15 = uVar15 - 0x10;
            uVar13 = uVar13 + 0x10;
          } while (iVar18 < ((int)(((uint)(local_98 >> 0x1f) & 1) + (int)local_98) >> 1) + -1);
        }
      }
      else {
        DrawBullsEye(local_a0,uVar24,5);
      }
      pvVar3 = (void *)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._1_7_,
                                local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
      }
      if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_148._M_dataplus._M_p,
                        local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
      }
      if ((pointer)local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p,
                        local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
      }
      if ((pointer)local_f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
      }
      pvVar3 = (void *)CONCAT44(local_70._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_70._bits.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_70._bits.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      return __return_storage_ptr__;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Data to large for user specified layer");
  }
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

EncodeResult
Encoder::Encode(const std::string& data, int minECCPercent, int userSpecifiedLayers)
{
	// High-level encode
	BitArray bits = HighLevelEncoder::Encode(data);

	// stuff bits and choose symbol size
	int eccBits = bits.size() * minECCPercent / 100 + 11;
	int totalSizeBits = bits.size() + eccBits;
	bool compact;
	int layers;
	int totalBitsInLayer;
	int wordSize;
	BitArray stuffedBits;
	if (userSpecifiedLayers != DEFAULT_AZTEC_LAYERS) {
		compact = userSpecifiedLayers < 0;
		layers = std::abs(userSpecifiedLayers);
		if (layers > (compact ? MAX_NB_BITS_COMPACT : MAX_NB_BITS)) {
			throw std::invalid_argument("Illegal value for layers: " + std::to_string(userSpecifiedLayers));
		}
		totalBitsInLayer = TotalBitsInLayer(layers, compact);
		wordSize = WORD_SIZE[layers];
		int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
		StuffBits(bits, wordSize, stuffedBits);
		if (stuffedBits.size() + eccBits > usableBitsInLayers) {
			throw std::invalid_argument("Data to large for user specified layer");
		}
		if (compact && stuffedBits.size() > wordSize * 64) {
			// Compact format only allows 64 data words, though C4 can hold more words than that
			throw std::invalid_argument("Data to large for user specified layer");
		}
	}
	else {
		wordSize = 0;
		// We look at the possible table sizes in the order Compact1, Compact2, Compact3,
		// Compact4, Normal4,...  Normal(i) for i < 4 isn't typically used since Compact(i+1)
		// is the same size, but has more data.
		for (int i = 0; ; i++) {
			if (i > MAX_NB_BITS) {
				throw std::invalid_argument("Data too large for an Aztec code");
			}
			compact = i <= 3;
			layers = compact ? i + 1 : i;
			totalBitsInLayer = TotalBitsInLayer(layers, compact);
			if (totalSizeBits > totalBitsInLayer) {
				continue;
			}
			// [Re]stuff the bits if this is the first opportunity, or if the
			// wordSize has changed
			if (wordSize != WORD_SIZE[layers]) {
				wordSize = WORD_SIZE[layers];
				StuffBits(bits, wordSize, stuffedBits);
			}
			int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
			if (compact && stuffedBits.size() > wordSize * 64) {
				// Compact format only allows 64 data words, though C4 can hold more words than that
				continue;
			}
			if (stuffedBits.size() + eccBits <= usableBitsInLayers) {
				break;
			}
		}
	}
	BitArray messageBits;
	GenerateCheckWords(stuffedBits, totalBitsInLayer, wordSize, messageBits);

	// generate mode message
	int messageSizeInWords = stuffedBits.size() / wordSize;
	BitArray modeMessage;
	GenerateModeMessage(compact, layers, messageSizeInWords, modeMessage);

	// allocate symbol
	int baseMatrixSize = (compact ? 11 : 14) + layers * 4; // not including alignment lines
	std::vector<int> alignmentMap(baseMatrixSize, 0);
	int matrixSize;
	if (compact) {
		// no alignment marks in compact mode, alignmentMap is a no-op
		matrixSize = baseMatrixSize;
		std::iota(alignmentMap.begin(), alignmentMap.end(), 0);
	}
	else {
		matrixSize = baseMatrixSize + 1 + 2 * ((baseMatrixSize / 2 - 1) / 15);
		int origCenter = baseMatrixSize / 2;
		int center = matrixSize / 2;
		for (int i = 0; i < origCenter; i++) {
			int newOffset = i + i / 15;
			alignmentMap[origCenter - i - 1] = center - newOffset - 1;
			alignmentMap[origCenter + i] = center + newOffset + 1;
		}
	}

	EncodeResult output{compact, matrixSize, layers, messageSizeInWords, BitMatrix(matrixSize)};

	BitMatrix& matrix = output.matrix;

	// draw data bits
	for (int i = 0, rowOffset = 0; i < layers; i++) {
		int rowSize = (layers - i) * 4 + (compact ? 9 : 12);
		for (int j = 0; j < rowSize; j++) {
			int columnOffset = j * 2;
			for (int k = 0; k < 2; k++) {
				if (messageBits.get(rowOffset + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + k], alignmentMap[i * 2 + j]);
				}
				if (messageBits.get(rowOffset + rowSize * 2 + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + j], alignmentMap[baseMatrixSize - 1 - i * 2 - k]);
				}
				if (messageBits.get(rowOffset + rowSize * 4 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - k], alignmentMap[baseMatrixSize - 1 - i * 2 - j]);
				}
				if (messageBits.get(rowOffset + rowSize * 6 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - j], alignmentMap[i * 2 + k]);
				}
			}
		}
		rowOffset += rowSize * 8;
	}

	// draw mode message
	DrawModeMessage(matrix, compact, matrixSize, modeMessage);

	// draw alignment marks
	if (compact) {
		DrawBullsEye(matrix, matrixSize / 2, 5);
	}
	else {
		DrawBullsEye(matrix, matrixSize / 2, 7);
		for (int i = 0, j = 0; i < baseMatrixSize / 2 - 1; i += 15, j += 16) {
			for (int k = (matrixSize / 2) & 1; k < matrixSize; k += 2) {
				matrix.set(matrixSize / 2 - j, k);
				matrix.set(matrixSize / 2 + j, k);
				matrix.set(k, matrixSize / 2 - j);
				matrix.set(k, matrixSize / 2 + j);
			}
		}
	}
	return output;
}